

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

bool __thiscall Rml::Element::Project(Element *this,Vector2f *point)

{
  float y;
  bool bVar1;
  pointer pTVar2;
  Matrix4f *pMVar3;
  float fVar4;
  VectorType VVar5;
  Vector3<float> VVar6;
  Vector2f local_110;
  Vector3<float> local_108;
  Vector3<float> local_f8;
  Vector3<float> local_e8;
  undefined8 local_d8;
  Vector3f p;
  float t;
  undefined1 local_b8 [8];
  Vector3f ray;
  undefined1 local_88 [8];
  Vector3f local_points [2];
  undefined1 auStack_48 [8];
  Vector4f window_points [2];
  Matrix4f *inv_transform;
  Vector2f *point_local;
  Element *this_local;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->transform_state);
  if (bVar1) {
    pTVar2 = ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
             operator->(&this->transform_state);
    pMVar3 = TransformState::GetTransform(pTVar2);
    if (pMVar3 != (Matrix4f *)0x0) {
      pTVar2 = ::std::unique_ptr<Rml::TransformState,_std::default_delete<Rml::TransformState>_>::
               operator->(&this->transform_state);
      window_points[1]._8_8_ = TransformState::GetInverseTransform(pTVar2);
      if ((Matrix4f *)window_points[1]._8_8_ != (Matrix4f *)0x0) {
        Vector4<float>::Vector4((Vector4<float> *)auStack_48,point->x,point->y,-10.0,1.0);
        Vector4<float>::Vector4((Vector4<float> *)&window_points[0].z,point->x,point->y,10.0,1.0);
        VVar5 = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator*
                          ((Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)window_points[1]._8_8_
                           ,(VectorType *)auStack_48);
        auStack_48 = VVar5._0_8_;
        window_points[0]._0_8_ = VVar5._8_8_;
        VVar5 = Matrix4<float,_Rml::ColumnMajorStorage<float>_>::operator*
                          ((Matrix4<float,_Rml::ColumnMajorStorage<float>_> *)window_points[1]._8_8_
                           ,(VectorType *)&window_points[0].z);
        window_points[0]._8_8_ = VVar5._0_8_;
        window_points[1]._0_8_ = VVar5._8_8_;
        VVar6 = Vector4<float>::PerspectiveDivide((VectorType *)auStack_48);
        local_points[0].x = VVar6.z;
        local_88 = VVar6._0_8_;
        VVar6 = Vector4<float>::PerspectiveDivide((Vector4<float> *)&window_points[0].z);
        local_points[1].x = VVar6.z;
        register0x00001200 = VVar6._0_8_;
        local_points[0]._4_8_ = register0x00001200;
        VVar6 = Vector3<float>::operator-
                          ((Vector3<float> *)&local_points[0].y,(Vector3<float> *)local_88);
        ray.x = VVar6.z;
        register0x00001200 = VVar6._0_8_;
        local_b8 = (undefined1  [8])register0x00001200;
        fVar4 = Math::Absolute(ray.x);
        if (1.0 < fVar4) {
          p.y = -local_points[0].x / ray.x;
          local_f8 = Vector3<float>::operator*((Vector3<float> *)local_b8,p.y);
          local_e8 = local_f8;
          local_108 = Vector3<float>::operator+((Vector3<float> *)local_88,&local_e8);
          p.x = local_108.z;
          local_d8._0_4_ = local_108.x;
          fVar4 = (float)local_d8;
          local_d8._4_4_ = local_108.y;
          y = local_d8._4_4_;
          local_d8 = local_108._0_8_;
          Vector2<float>::Vector2(&local_110,fVar4,y);
          *point = local_110;
          return true;
        }
      }
      return false;
    }
  }
  return true;
}

Assistant:

bool Element::Project(Vector2f& point) const noexcept
{
	if (!transform_state || !transform_state->GetTransform())
		return true;

	// The input point is in window coordinates. Need to find the projection of the point onto the current element plane,
	// taking into account the full transform applied to the element.

	if (const Matrix4f* inv_transform = transform_state->GetInverseTransform())
	{
		// Pick two points forming a line segment perpendicular to the window.
		Vector4f window_points[2] = {{point.x, point.y, -10, 1}, {point.x, point.y, 10, 1}};

		// Project them into the local element space.
		window_points[0] = *inv_transform * window_points[0];
		window_points[1] = *inv_transform * window_points[1];

		Vector3f local_points[2] = {window_points[0].PerspectiveDivide(), window_points[1].PerspectiveDivide()};

		// Construct a ray from the two projected points in the local space of the current element.
		// Find the intersection with the z=0 plane to produce our destination point.
		Vector3f ray = local_points[1] - local_points[0];

		// Only continue if we are not close to parallel with the plane.
		if (Math::Absolute(ray.z) > 1.0f)
		{
			// Solving the line equation p = p0 + t*ray for t, knowing that p.z = 0, produces the following.
			float t = -local_points[0].z / ray.z;
			Vector3f p = local_points[0] + ray * t;

			point = Vector2f(p.x, p.y);
			return true;
		}
	}

	// The transformation matrix is either singular, or the ray is parallel to the element's plane.
	return false;
}